

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrAlgo.h
# Opt level: O0

bool __thiscall InplaceStr::operator==(InplaceStr *this,InplaceStr *rhs)

{
  int iVar1;
  bool local_29;
  InplaceStr *rhs_local;
  InplaceStr *this_local;
  
  if ((this->begin == rhs->begin) && (this->end == rhs->end)) {
    this_local._7_1_ = true;
  }
  else {
    local_29 = false;
    if ((int)this->end - (int)this->begin == (int)rhs->end - (int)rhs->begin) {
      iVar1 = memcmp(this->begin,rhs->begin,(ulong)(uint)((int)this->end - (int)this->begin));
      local_29 = iVar1 == 0;
    }
    this_local._7_1_ = local_29;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const InplaceStr& rhs) const
	{
		if(begin == rhs.begin && end == rhs.end)
			return true;

		return unsigned(end - begin) == unsigned(rhs.end - rhs.begin) && memcmp(begin, rhs.begin, unsigned(end - begin)) == 0;
	}